

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          size_t size,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::bin_writer<1>_>
          f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  char __tmp;
  size_t __len_1;
  ulong uVar4;
  size_t __len;
  size_t __n;
  char *pcVar5;
  char *local_38;
  
  uVar4 = (ulong)spec->width_;
  __n = uVar4 - size;
  if (uVar4 < size || __n == 0) {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar4 = size + lVar3;
    if ((ulong)puVar2[3] < uVar4) {
      (**(code **)*puVar2)(puVar2,uVar4);
    }
    puVar2[2] = uVar4;
    local_38 = (char *)(lVar3 + puVar2[1]);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                  *)&f,&local_38);
  }
  else {
    puVar2 = *(undefined8 **)this;
    lVar3 = puVar2[2];
    uVar4 = uVar4 + lVar3;
    if ((ulong)puVar2[3] < uVar4) {
      (**(code **)*puVar2)(puVar2,uVar4);
    }
    puVar2[2] = uVar4;
    local_38 = (char *)(lVar3 + puVar2[1]);
    bVar1 = (byte)spec->fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar4 = __n >> 1;
      pcVar5 = local_38;
      if (1 < __n) {
        pcVar5 = local_38 + uVar4;
        memset(local_38,(uint)bVar1,uVar4);
      }
      local_38 = pcVar5;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                    *)&f,&local_38);
      __n = __n - uVar4;
    }
    else {
      if (spec->align_ == ALIGN_RIGHT) {
        pcVar5 = local_38 + __n;
        memset(local_38,(uint)bVar1,__n);
        local_38 = pcVar5;
        padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
        ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                      *)&f,&local_38);
        return;
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>>
                    *)&f,&local_38);
    }
    memset(local_38,(uint)bVar1,__n);
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}